

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int writeout(FILE **ffp,buffer *bp,char *fn)

{
  int iVar1;
  uint eobnl;
  int iVar2;
  int *piVar3;
  char *fmt;
  char local_4c8 [8];
  char dp [1024];
  undefined1 local_c0 [8];
  stat statbuf;
  
  iVar1 = stat(fn,(stat *)local_c0);
  if ((iVar1 == -1) && (piVar3 = __errno_location(), *piVar3 == 2)) {
    *piVar3 = 0;
    xdirname(local_4c8,fn,0x400);
    strlcat(local_4c8,"/",0x400);
    iVar1 = access(local_4c8,2);
    if ((iVar1 == 0) || (*piVar3 != 0xd)) {
      if (*piVar3 != 2) goto LAB_001102be;
      dobeep();
      fmt = "%s: no such directory";
    }
    else {
      dobeep();
      fmt = "Directory %s write-protected";
    }
    ewprintf(fmt,local_4c8);
    return 3;
  }
LAB_001102be:
  eobnl = 0;
  if ((bp->b_headp->l_bp->l_used != 0) &&
     (eobnl = eyorn("No newline at end of file, add one"), 1 < eobnl)) {
    return eobnl;
  }
  iVar1 = ffwopen(ffp,fn,bp);
  if (iVar1 == 0) {
    iVar1 = ffputbuf(*ffp,bp,eobnl);
    iVar2 = ffclose(*ffp,bp);
    if (iVar1 == 0) {
      iVar1 = 0;
      if (iVar2 == 0) {
        ewprintf("Wrote %s",fn);
        iVar1 = 1;
      }
    }
    else {
      dobeep();
      iVar1 = 0;
      ewprintf("Unable to write %s",fn);
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
writeout(FILE ** ffp, struct buffer *bp, char *fn)
{
	struct stat	 statbuf;
	struct line	*lpend;
	int		 s, eobnl;
	char		 dp[NFILEN];

	if (stat(fn, &statbuf) == -1 && errno == ENOENT) {
		errno = 0;
		(void)xdirname(dp, fn, sizeof(dp));
		(void)strlcat(dp, "/", sizeof(dp));
		if (access(dp, W_OK) && errno == EACCES) {
			dobeep();
			ewprintf("Directory %s write-protected", dp);
			return (FIOERR);
		} else if (errno == ENOENT) {
   			dobeep();
			ewprintf("%s: no such directory", dp);
			return (FIOERR);
		}
        }
	lpend = bp->b_headp;
	eobnl = 0;
	if (llength(lback(lpend)) != 0) {
		eobnl = eyorn("No newline at end of file, add one");
		if (eobnl != TRUE && eobnl != FALSE)
			return (eobnl); /* abort */
	}
	/* open writes message */
	if ((s = ffwopen(ffp, fn, bp)) != FIOSUC)
		return (FALSE);
	s = ffputbuf(*ffp, bp, eobnl);
	if (s == FIOSUC) {
		/* no write error */
		s = ffclose(*ffp, bp);
		if (s == FIOSUC)
			ewprintf("Wrote %s", fn);
	} else {
		/* print a message indicating write error */
		(void)ffclose(*ffp, bp);
		dobeep();
		ewprintf("Unable to write %s", fn);
	}
	return (s == FIOSUC);
}